

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::get_file_size(char *pFilename,uint64 *file_size)

{
  int iVar1;
  __off_t *in_RSI;
  char *in_RDI;
  int result;
  stat stat_buf;
  stat local_a8;
  __off_t *local_18;
  bool local_1;
  
  *in_RSI = 0;
  local_18 = in_RSI;
  iVar1 = stat(in_RDI,&local_a8);
  if (iVar1 == 0) {
    if ((local_a8.st_mode & 0xf000) == 0x8000) {
      *local_18 = local_a8.st_size;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool file_utils::get_file_size(const char* pFilename, uint64& file_size) {
  file_size = 0;
  struct stat stat_buf;
  int result = stat(pFilename, &stat_buf);
  if (result)
    return false;
  if (!S_ISREG(stat_buf.st_mode))
    return false;
  file_size = stat_buf.st_size;
  return true;
}